

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void BrotliEncoderSetCustomDictionary(BrotliEncoderState *s,size_t size,uint8_t *dict)

{
  ushort uVar1;
  H2 *self;
  H3 *self_00;
  H4 *self_01;
  H5 *self_02;
  H6 *self_03;
  H7 *self_04;
  H8 *self_05;
  H9 *self_06;
  H40 *self_07;
  H41 *self_08;
  H42 *self_09;
  H54 *self_10;
  H10 *self_11;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  MemoryManager *pMVar7;
  MemoryManager *m_00;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  ulong local_808;
  int local_7ec;
  MemoryManager *m;
  size_t dict_size;
  size_t max_dict_size;
  uint8_t *dict_local;
  size_t size_local;
  BrotliEncoderState *s_local;
  int hasher_type;
  int local_77c;
  long local_778;
  size_t i;
  size_t overlap;
  ulong local_740;
  size_t i_1;
  size_t overlap_1;
  ulong local_708;
  size_t i_2;
  size_t overlap_2;
  long local_6d0;
  size_t i_3;
  size_t overlap_3;
  long local_698;
  size_t i_4;
  size_t overlap_4;
  long local_660;
  size_t i_5;
  size_t overlap_5;
  long local_628;
  size_t i_6;
  size_t overlap_6;
  long local_5f0;
  size_t i_7;
  size_t overlap_7;
  ulong local_5b8;
  size_t i_8;
  size_t overlap_8;
  ulong local_580;
  size_t i_9;
  size_t overlap_9;
  ulong local_548;
  size_t i_10;
  size_t overlap_10;
  ulong local_510;
  size_t i_11;
  size_t overlap_11;
  ulong local_4d8;
  size_t i_12;
  size_t overlap_12;
  uint32_t off;
  uint32_t key;
  uint32_t off_1;
  uint32_t key_1;
  uint32_t off_2;
  uint32_t key_2;
  size_t minor_ix;
  uint32_t key_3;
  size_t minor_ix_1;
  uint32_t key_4;
  size_t minor_ix_2;
  uint32_t key_5;
  size_t minor_ix_3;
  uint32_t key_6;
  size_t minor_ix_4;
  uint32_t key_7;
  ulong local_338;
  size_t delta;
  size_t idx;
  size_t bank;
  size_t key_8;
  uint32_t h;
  uint32_t t;
  ulong local_2d8;
  size_t delta_1;
  size_t idx_1;
  size_t bank_1;
  size_t key_9;
  uint32_t h_1;
  uint32_t t_1;
  ulong local_278;
  size_t delta_2;
  size_t idx_2;
  size_t bank_2;
  size_t key_10;
  uint32_t h_2;
  uint32_t t_2;
  uint32_t off_3;
  uint32_t key_11;
  size_t max_backward;
  size_t len;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix;
  uint32_t key_12;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_78;
  size_t local_68;
  uint64_t t_6;
  uint64_t t_5;
  uint64_t t_4;
  uint64_t t_3;
  
  pMVar7 = (MemoryManager *)((1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10);
  m_00 = &s->memory_manager_;
  iVar3 = EnsureInitialized(s);
  if ((((iVar3 != 0) && (size != 0)) && ((s->params).quality != 0)) && ((s->params).quality != 1)) {
    m = (MemoryManager *)size;
    max_dict_size = (size_t)dict;
    if (pMVar7 < size) {
      max_dict_size = (size_t)(dict + (size - (long)pMVar7));
      m = pMVar7;
    }
    CopyInputToRingBuffer(s,(size_t)m,(uint8_t *)max_dict_size);
    s->last_flush_pos_ = (uint64_t)m;
    s->last_processed_pos_ = (uint64_t)m;
    if (m != (MemoryManager *)0x0) {
      s->prev_byte_ = *(uint8_t *)((long)m + (max_dict_size - 1));
    }
    if ((MemoryManager *)0x1 < m) {
      s->prev_byte2_ = *(uint8_t *)((long)m + (max_dict_size - 2));
    }
    if ((s->params).quality < 10) {
      if (((s->params).quality == 4) && (0xfffff < (s->params).size_hint)) {
        local_77c = 0x36;
      }
      else if ((s->params).quality < 5) {
        local_77c = (s->params).quality;
      }
      else if ((s->params).lgwin < 0x11) {
        if ((s->params).quality < 7) {
          local_7ec = 0x28;
        }
        else {
          local_7ec = 0x2a;
          if ((s->params).quality < 9) {
            local_7ec = 0x29;
          }
        }
        local_77c = local_7ec;
      }
      else {
        local_77c = (s->params).quality;
      }
    }
    else {
      local_77c = 10;
    }
    switch(local_77c) {
    case 2:
      self = (s->hashers_).h2;
      InitH2(m_00,self,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_778 = 0; (MemoryManager *)(local_778 + 7U) < m; local_778 = local_778 + 1) {
        uVar6 = HashBytesH2((uint8_t *)(max_dict_size + local_778));
        self->buckets_[uVar6] = (uint32_t)local_778;
      }
      break;
    case 3:
      self_00 = (s->hashers_).h3;
      InitH3(m_00,self_00,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_740 = 0; (MemoryManager *)(local_740 + 7) < m; local_740 = local_740 + 1) {
        uVar6 = HashBytesH3((uint8_t *)(max_dict_size + local_740));
        self_00->buckets_[uVar6 + ((uint)(local_740 >> 3) & 1)] = (uint32_t)local_740;
      }
      break;
    case 4:
      self_01 = (s->hashers_).h4;
      InitH4(m_00,self_01,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_708 = 0; (MemoryManager *)(local_708 + 7) < m; local_708 = local_708 + 1) {
        uVar6 = HashBytesH4((uint8_t *)(max_dict_size + local_708));
        self_01->buckets_[uVar6 + ((uint)(local_708 >> 3) & 3)] = (uint32_t)local_708;
      }
      break;
    case 5:
      self_02 = (s->hashers_).h5;
      InitH5(m_00,self_02,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_6d0 = 0; (MemoryManager *)(local_6d0 + 3U) < m; local_6d0 = local_6d0 + 1) {
        uVar6 = HashBytesH5((uint8_t *)(max_dict_size + local_6d0));
        self_02->buckets_[(long)(int)(self_02->num_[uVar6] & 0xf) + (ulong)(uVar6 << 4)] =
             (uint32_t)local_6d0;
        self_02->num_[uVar6] = self_02->num_[uVar6] + 1;
      }
      break;
    case 6:
      self_03 = (s->hashers_).h6;
      InitH6(m_00,self_03,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_698 = 0; (MemoryManager *)(local_698 + 3U) < m; local_698 = local_698 + 1) {
        uVar6 = HashBytesH6((uint8_t *)(max_dict_size + local_698));
        self_03->buckets_[(long)(int)(self_03->num_[uVar6] & 0x1f) + (ulong)(uVar6 << 5)] =
             (uint32_t)local_698;
        self_03->num_[uVar6] = self_03->num_[uVar6] + 1;
      }
      break;
    case 7:
      self_04 = (s->hashers_).h7;
      InitH7(m_00,self_04,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_660 = 0; (MemoryManager *)(local_660 + 3U) < m; local_660 = local_660 + 1) {
        uVar6 = HashBytesH7((uint8_t *)(max_dict_size + local_660));
        self_04->buckets_[(long)(int)(self_04->num_[uVar6] & 0x3f) + (ulong)(uVar6 << 6)] =
             (uint32_t)local_660;
        self_04->num_[uVar6] = self_04->num_[uVar6] + 1;
      }
      break;
    case 8:
      self_05 = (s->hashers_).h8;
      InitH8(m_00,self_05,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_628 = 0; (MemoryManager *)(local_628 + 3U) < m; local_628 = local_628 + 1) {
        uVar6 = HashBytesH8((uint8_t *)(max_dict_size + local_628));
        self_05->buckets_[(long)(int)(self_05->num_[uVar6] & 0x7f) + (ulong)(uVar6 << 7)] =
             (uint32_t)local_628;
        self_05->num_[uVar6] = self_05->num_[uVar6] + 1;
      }
      break;
    case 9:
      self_06 = (s->hashers_).h9;
      InitH9(m_00,self_06,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_5f0 = 0; (MemoryManager *)(local_5f0 + 3U) < m; local_5f0 = local_5f0 + 1) {
        uVar6 = HashBytesH9((uint8_t *)(max_dict_size + local_5f0));
        self_06->buckets_[(long)(int)(self_06->num_[uVar6] & 0xff) + (ulong)(uVar6 << 8)] =
             (uint32_t)local_5f0;
        self_06->num_[uVar6] = self_06->num_[uVar6] + 1;
      }
      break;
    case 10:
      self_11 = (s->hashers_).h10;
      sVar9 = StoreLookaheadH10();
      InitH10(m_00,self_11,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_4d8 = 0; (MemoryManager *)(local_4d8 + (sVar9 - 1)) < m; local_4d8 = local_4d8 + 1)
      {
        sVar2 = self_11->window_mask_;
        cur_ix_masked = 0;
        uVar6 = HashBytesH10((uint8_t *)(max_dict_size + local_4d8));
        uVar4 = self_11->buckets_[uVar6];
        node_right = (local_4d8 & self_11->window_mask_) << 1;
        best_len_left = (local_4d8 & self_11->window_mask_) * 2 + 1;
        best_len_right = 0;
        depth_remaining = 0;
        self_11->buckets_[uVar6] = (uint32_t)local_4d8;
        backward = 0x40;
        while( true ) {
          node_left = (size_t)uVar4;
          uVar10 = local_4d8 - node_left;
          if (((uVar10 == 0) || (sVar2 - 0xf < uVar10)) || (backward == 0)) break;
          if (best_len_right < depth_remaining) {
            local_808 = best_len_right;
          }
          else {
            local_808 = depth_remaining;
          }
          if (0x80 < local_808) {
            __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0x9d,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          lVar11 = max_dict_size + local_4d8 + local_808;
          local_78 = (ulong *)(max_dict_size + node_left + local_808);
          limit2 = 0;
          x = (0x80 - local_808 >> 3) + 1;
LAB_00183c16:
          x = x - 1;
          if (x != 0) {
            if (*local_78 == *(ulong *)(lVar11 + limit2)) goto LAB_00183c73;
            iVar3 = 0;
            for (uVar8 = *local_78 ^ *(ulong *)(lVar11 + limit2); (uVar8 & 1) == 0;
                uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              iVar3 = iVar3 + 1;
            }
            local_68 = ((ulong)(long)iVar3 >> 3) + limit2;
            goto LAB_00183d64;
          }
          matched = (0x80 - local_808 & 7) + 1;
          while (matched = matched - 1, matched != 0) {
            if (*(char *)(lVar11 + limit2) != (char)*local_78) {
              local_68 = limit2;
              goto LAB_00183d64;
            }
            local_78 = (ulong *)((long)local_78 + 1);
            limit2 = limit2 + 1;
          }
          local_68 = limit2;
LAB_00183d64:
          __n = local_808 + local_68;
          iVar3 = memcmp((void *)(max_dict_size + local_4d8),(void *)(max_dict_size + node_left),__n
                        );
          if (iVar3 != 0) {
            __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0xa2,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          if ((cur_ix_masked != 0) && (sRam0000000000000000 < __n)) {
            sRam0000000000000000 = __n;
            *(int *)cur_ix_masked = (int)uVar10;
            *(int *)(cur_ix_masked + 4) = (int)__n * 0x20;
            cur_ix_masked = cur_ix_masked + 8;
          }
          if (0x7f < __n) {
            self_11->forest_[node_right] = self_11->forest_[(node_left & self_11->window_mask_) * 2]
            ;
            self_11->forest_[best_len_left] =
                 self_11->forest_[(node_left & self_11->window_mask_) * 2 + 1];
            goto LAB_001840b4;
          }
          if (*(byte *)(max_dict_size + node_left + __n) <
              *(byte *)(max_dict_size + local_4d8 + __n)) {
            self_11->forest_[node_right] = uVar4;
            node_right = (node_left & self_11->window_mask_) * 2 + 1;
            uVar4 = self_11->forest_[node_right];
            best_len_right = __n;
          }
          else {
            self_11->forest_[best_len_left] = uVar4;
            uVar10 = node_left & self_11->window_mask_;
            best_len_left = uVar10 * 2;
            uVar4 = self_11->forest_[uVar10 * 2];
            depth_remaining = __n;
          }
          backward = backward - 1;
        }
        self_11->forest_[node_right] = self_11->invalid_pos_;
        self_11->forest_[best_len_left] = self_11->invalid_pos_;
LAB_001840b4:
      }
      break;
    default:
      break;
    case 0x28:
      self_07 = (s->hashers_).h40;
      InitH40(m_00,self_07,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_5b8 = 0; (MemoryManager *)(local_5b8 + 3) < m; local_5b8 = local_5b8 + 1) {
        uVar4 = (uint)(*(int *)(max_dict_size + local_5b8) * 0x1e35a7bd) >> 0x11;
        uVar1 = self_07->free_slot_idx[0];
        self_07->free_slot_idx[0] = uVar1 + 1;
        local_338 = local_5b8 - self_07->addr[uVar4];
        self_07->tiny_hash[local_5b8 & 0xffff] = (uint8_t)uVar4;
        if (0xffff < local_338) {
          local_338 = 0xffff;
        }
        self_07->banks[0].slots[(int)(uint)uVar1].delta = (uint16_t)local_338;
        self_07->banks[0].slots[(int)(uint)uVar1].next = self_07->head[uVar4];
        self_07->addr[uVar4] = (uint32_t)local_5b8;
        self_07->head[uVar4] = uVar1;
      }
      break;
    case 0x29:
      self_08 = (s->hashers_).h41;
      InitH41(m_00,self_08,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_580 = 0; (MemoryManager *)(local_580 + 3) < m; local_580 = local_580 + 1) {
        uVar4 = (uint)(*(int *)(max_dict_size + local_580) * 0x1e35a7bd) >> 0x11;
        uVar1 = self_08->free_slot_idx[0];
        self_08->free_slot_idx[0] = uVar1 + 1;
        local_2d8 = local_580 - self_08->addr[uVar4];
        self_08->tiny_hash[local_580 & 0xffff] = (uint8_t)uVar4;
        if (0xffff < local_2d8) {
          local_2d8 = 0xffff;
        }
        self_08->banks[0].slots[(int)(uint)uVar1].delta = (uint16_t)local_2d8;
        self_08->banks[0].slots[(int)(uint)uVar1].next = self_08->head[uVar4];
        self_08->addr[uVar4] = (uint32_t)local_580;
        self_08->head[uVar4] = uVar1;
      }
      break;
    case 0x2a:
      self_09 = (s->hashers_).h42;
      InitH42(m_00,self_09,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_548 = 0; (MemoryManager *)(local_548 + 3) < m; local_548 = local_548 + 1) {
        uVar4 = (uint)(*(int *)(max_dict_size + local_548) * 0x1e35a7bd) >> 0x11;
        uVar10 = (ulong)uVar4;
        uVar8 = uVar10 & 0x1ff;
        uVar1 = self_09->free_slot_idx[uVar8];
        self_09->free_slot_idx[uVar8] = uVar1 + 1;
        uVar5 = uVar1 & 0x1ff;
        local_278 = local_548 - self_09->addr[uVar10];
        self_09->tiny_hash[local_548 & 0xffff] = (uint8_t)uVar4;
        if (0xffff < local_278) {
          local_278 = 0xffff;
        }
        self_09->banks[uVar8].slots[(int)uVar5].delta = (uint16_t)local_278;
        self_09->banks[uVar8].slots[(int)uVar5].next = self_09->head[uVar10];
        self_09->addr[uVar10] = (uint32_t)local_548;
        self_09->head[uVar10] = (uint16_t)uVar5;
      }
      break;
    case 0x36:
      self_10 = (s->hashers_).h54;
      InitH54(m_00,self_10,(uint8_t *)max_dict_size,&s->params,0,(size_t)m,0);
      for (local_510 = 0; (MemoryManager *)(local_510 + 7) < m; local_510 = local_510 + 1) {
        uVar6 = HashBytesH54((uint8_t *)(max_dict_size + local_510));
        self_10->buckets_[uVar6 + ((uint)(local_510 >> 3) & 3)] = (uint32_t)local_510;
      }
    }
  }
  return;
LAB_00183c73:
  local_78 = local_78 + 1;
  limit2 = limit2 + 8;
  goto LAB_00183c16;
}

Assistant:

void BrotliEncoderSetCustomDictionary(BrotliEncoderState* s, size_t size,
                                      const uint8_t* dict) {
  size_t max_dict_size = BROTLI_MAX_BACKWARD_LIMIT(s->params.lgwin);
  size_t dict_size = size;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return;

  if (dict_size == 0 ||
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return;
  }
  if (size > max_dict_size) {
    dict += size - max_dict_size;
    dict_size = max_dict_size;
  }
  CopyInputToRingBuffer(s, dict_size, dict);
  s->last_flush_pos_ = dict_size;
  s->last_processed_pos_ = dict_size;
  if (dict_size > 0) {
    s->prev_byte_ = dict[dict_size - 1];
  }
  if (dict_size > 1) {
    s->prev_byte2_ = dict[dict_size - 2];
  }
  HashersPrependCustomDictionary(m, &s->hashers_, &s->params, dict_size, dict);
  if (BROTLI_IS_OOM(m)) return;
}